

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::JavaGenerator::GenGetterForLookupByKey
          (string *__return_storage_ptr__,JavaGenerator *this,FieldDef *key_field,
          string *data_buffer,char *num)

{
  Type *type_00;
  bool bVar1;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  undefined1 local_a5;
  undefined1 local_98 [8];
  string dest_cast;
  string dest_mask;
  Type type;
  char *num_local;
  string *data_buffer_local;
  FieldDef *key_field_local;
  JavaGenerator *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *getter;
  
  dest_mask.field_2._8_4_ = (key_field->value).type.base_type;
  dest_mask.field_2._12_4_ = (key_field->value).type.element;
  type_00 = (Type *)((long)&dest_mask.field_2 + 8);
  DestinationMask_abi_cxx11_((string *)((long)&dest_cast.field_2 + 8),this,type_00,true);
  DestinationCast_abi_cxx11_((string *)local_98,this,type_00);
  local_a5 = 0;
  std::operator+(__return_storage_ptr__,data_buffer,".get");
  GenTypeBasic_abi_cxx11_(&local_c8,this,(Type *)((long)&dest_mask.field_2 + 8));
  bVar1 = std::operator!=(&local_c8,"byte");
  std::__cxx11::string::~string((string *)&local_c8);
  if (bVar1) {
    GenTypeBasic_abi_cxx11_(&local_108,this,(Type *)((long)&dest_mask.field_2 + 8));
    ConvertCase(&local_e8,&local_108,kUpperCamel,kSnake);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::operator+(&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 __return_storage_ptr__);
  std::operator+(&local_188,&local_1a8,"(");
  GenOffsetGetter_abi_cxx11_(&local_1c8,this,key_field,num);
  std::operator+(&local_168,&local_188,&local_1c8);
  std::operator+(&local_148,&local_168,")");
  std::operator+(&local_128,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dest_cast.field_2 + 8));
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  local_a5 = 1;
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(dest_cast.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetterForLookupByKey(flatbuffers::FieldDef *key_field,
                                      const std::string &data_buffer,
                                      const char *num = nullptr) const {
    auto type = key_field->value.type;
    auto dest_mask = DestinationMask(type, true);
    auto dest_cast = DestinationCast(type);
    auto getter = data_buffer + ".get";
    if (GenTypeBasic(type) != "byte") {
      getter += ConvertCase(GenTypeBasic(type), Case::kUpperCamel);
    }
    getter = dest_cast + getter + "(" + GenOffsetGetter(key_field, num) + ")" +
             dest_mask;
    return getter;
  }